

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

void EndVisitCatch(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  byte bVar1;
  Scope *pSVar2;
  FuncInfo *this;
  ParseableFunctionInfo *pPVar3;
  code *pcVar4;
  bool bVar5;
  ParseNodeCatch *pPVar6;
  undefined4 *puVar7;
  FunctionInfo *pFVar8;
  
  pPVar6 = ParseNode::AsParseNodeCatch(pnode);
  pSVar2 = pPVar6->scope;
  if ((pSVar2->innerScopeIndex != 0xffffffff) &&
     (bVar1 = byteCodeGenerator->m_utf8SourceInfo->field_0xa8,
     (byte)((bVar1 >> 5 | (byteCodeGenerator->m_utf8SourceInfo->debugModeSource).ptr != (uchar *)0x0
            ) & (bVar1 & 0x40) >> 6) == 0)) {
    this = pSVar2->func;
    pPVar3 = this->byteCodeFunction;
    pFVar8 = (pPVar3->super_FunctionProxy).functionInfo.ptr;
    if (pFVar8 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x50d,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar5) goto LAB_0082012e;
      *puVar7 = 0;
      pFVar8 = (pPVar3->super_FunctionProxy).functionInfo.ptr;
    }
    if ((ParseableFunctionInfo *)(pFVar8->functionBodyImpl).ptr != pPVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x50e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                         "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar5) goto LAB_0082012e;
      *puVar7 = 0;
      pFVar8 = (pPVar3->super_FunctionProxy).functionInfo.ptr;
    }
    if ((pFVar8->attributes & (Async|Generator)) == None) {
      if (pSVar2->innerScopeIndex != this->currentInnerScopeIndex) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0xa6,"(scope->GetInnerScopeIndex() == func->CurrentInnerScopeIndex())",
                           "scope->GetInnerScopeIndex() == func->CurrentInnerScopeIndex()");
        if (!bVar5) {
LAB_0082012e:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar7 = 0;
      }
      FuncInfo::ReleaseInnerScopeIndex(this);
    }
  }
  ByteCodeGenerator::PopScope(byteCodeGenerator);
  return;
}

Assistant:

void EndVisitCatch(ParseNode *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    Scope *scope = pnode->AsParseNodeCatch()->scope;
    FuncInfo *func = scope->GetFunc();

    if (scope->HasInnerScopeIndex() && !(byteCodeGenerator->IsInDebugMode() || func->byteCodeFunction->IsCoroutine()))
    {
        // In debug mode (or for the generator/async function), don't release the current index, as we're giving each scope a unique index,
        // regardless of nesting.

        Assert(scope->GetInnerScopeIndex() == func->CurrentInnerScopeIndex());
        func->ReleaseInnerScopeIndex();
    }

    byteCodeGenerator->PopScope();
}